

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint_Contact.cc
# Opt level: O0

void __thiscall
RigidBodyDynamics::ContactConstraint::calcPointForceJacobian
          (ContactConstraint *this,Model *model,VectorNd *Q,ConstraintCache *cache,
          vector<SpatialVector_t,_std::allocator<SpatialVector_t>_> *fExtSysUpd,
          bool updateKinematics)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *in_R8;
  uint i;
  bool in_stack_0000013f;
  Vector3d *in_stack_00000140;
  uint in_stack_0000014c;
  VectorNd *in_stack_00000150;
  Model *in_stack_00000158;
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffff28;
  DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *in_stack_ffffffffffffff30;
  uint local_64;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x38),0);
  std::
  vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
  ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                *)(in_RDI + 0x50),0);
  CalcBodyToBaseCoordinates
            (in_stack_00000158,in_stack_00000150,in_stack_0000014c,in_stack_00000140,
             in_stack_0000013f);
  Vector3_t::operator=
            ((Vector3_t *)in_stack_ffffffffffffff30,(Vector3_t *)in_stack_ffffffffffffff28);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator-(in_RDI);
  Vector3_t::operator=((Vector3_t *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff30,(Index)in_stack_ffffffffffffff28);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff30,(Index)in_stack_ffffffffffffff28);
  *pSVar2 = 0.0;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                     (in_stack_ffffffffffffff30,(Index)in_stack_ffffffffffffff28);
  *pSVar2 = 0.0;
  for (local_64 = 0; local_64 < *(uint *)(in_RDI + 0x30); local_64 = local_64 + 1) {
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDI + 0xd8),(ulong)local_64);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffff30,(Index)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff30 =
         (DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1> *)
         ((ulong)*pSVar3 ^ 0x8000000000000000);
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       (in_stack_ffffffffffffff30,(Index)in_stack_ffffffffffffff28);
    *pSVar2 = (Scalar)in_stack_ffffffffffffff30;
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDI + 0xd8),(ulong)local_64);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffff30,(Index)in_stack_ffffffffffffff28);
    SVar1 = *pSVar3;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       (in_stack_ffffffffffffff30,(Index)in_stack_ffffffffffffff28);
    *pSVar2 = -SVar1;
    std::vector<Vector3_t,_std::allocator<Vector3_t>_>::operator[]
              ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)(in_RDI + 0xd8),(ulong)local_64);
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffff30,(Index)in_stack_ffffffffffffff28);
    SVar1 = *pSVar3;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_1>::operator[]
                       (in_stack_ffffffffffffff30,(Index)in_stack_ffffffffffffff28);
    *pSVar2 = -SVar1;
    Math::SpatialTransform::applyAdjoint((SpatialTransform *)cache,(SpatialVector *)fExtSysUpd);
    std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
              (in_R8,(ulong)(*(int *)(in_RDI + 0x34) + local_64));
    SpatialVector_t::operator=
              ((SpatialVector_t *)in_stack_ffffffffffffff30,
               (SpatialVector_t *)in_stack_ffffffffffffff28);
  }
  return;
}

Assistant:

void ContactConstraint::
      calcPointForceJacobian(
        Model &model,
        const Math::VectorNd &Q,
        ConstraintCache &cache,
        std::vector<Math::SpatialVector> &fExtSysUpd,
        bool updateKinematics)
{
  cache.vec3A = CalcBodyToBaseCoordinates(
                  model,Q,bodyIds[0],bodyFrames[0].r,updateKinematics);
  cache.stA.E.Identity();
  cache.stA.r = -cache.vec3A;
  cache.svecA[0]=0.;
  cache.svecA[1]=0.;
  cache.svecA[2]=0.;
  for(unsigned int i=0; i<sizeOfConstraint;++i){
    cache.svecA[3] = -T[i][0];
    cache.svecA[4] = -T[i][1];
    cache.svecA[5] = -T[i][2];
    fExtSysUpd[rowInSystem+i] = cache.stA.applyAdjoint( cache.svecA );
  }
}